

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O3

int * compute_cells(int *dims,int *ncells)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  lVar2 = ((long)dims[2] + -1) * ((long)dims[1] + -1) * ((long)*dims + -1);
  *ncells = (int)lVar2;
  piVar3 = (int *)malloc(lVar2 * 0x18);
  iVar15 = dims[2];
  if (1 < iVar15) {
    iVar13 = *dims;
    iVar9 = dims[1];
    iVar4 = (iVar9 + -1) * (iVar13 + -1) * iVar15;
    iVar7 = ((iVar15 + -1) * iVar9 + iVar15 * (iVar9 + -1)) * (iVar13 + -1);
    iVar5 = 0;
    iVar6 = 1;
    piVar8 = piVar3;
    do {
      if (1 < iVar9) {
        iVar15 = 0;
        do {
          if (1 < iVar13) {
            iVar9 = iVar13 + -1;
            iVar10 = 0;
            do {
              iVar14 = iVar5 * dims[1];
              iVar1 = iVar4 + iVar10;
              iVar11 = dims[1] + -1;
              iVar12 = iVar11 * iVar5 + iVar15;
              iVar13 = iVar12 * iVar13;
              *piVar8 = (iVar15 + iVar14) * iVar9 + iVar1;
              piVar8[1] = (iVar14 + iVar15 + 1) * iVar9 + iVar1;
              piVar8[2] = iVar13 + iVar7 + 1 + iVar10;
              piVar8[3] = iVar7 + iVar10 + iVar13;
              piVar8[4] = (iVar6 * iVar11 + iVar15) * iVar9 + iVar10;
              piVar8[5] = iVar9 * iVar12 + iVar10;
              piVar8 = piVar8 + 6;
              iVar10 = iVar10 + 1;
              iVar13 = *dims;
              iVar9 = iVar13 + -1;
            } while (iVar10 < iVar9);
            iVar9 = dims[1];
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < iVar9 + -1);
        iVar15 = dims[2];
      }
      iVar5 = iVar5 + 1;
      iVar6 = iVar6 + 1;
    } while (iVar5 < iVar15 + -1);
  }
  return piVar3;
}

Assistant:

int *
compute_cells(const int *dims, int *ncells) {
  int i,j,k;
  *ncells = (dims[0]-1)*(dims[1]-1)*(dims[2]-1);
  int *cells = (int *)malloc(*ncells * sizeof(int)*6);
  int *cptr = cells;

  int F1 = (dims[0]-1)*(dims[1]-1)*dims[2];     /* back/front */
  int F2 = (dims[0]-1)*(dims[1])  *(dims[2]-1); /* bottom/top */
  // int F3 = (dims[0])  *(dims[1]-1)*(dims[2]-1); /* left/right */

  for(k = 0; k < dims[2]-1; k++)
    for(j = 0; j < dims[1]-1; j++)
      for(i = 0; i < dims[0]-1; i++) {
        int f0 = F1 + k*(dims[0]-1)*dims[1] + j*(dims[0]-1) + i;     /* bottom */
        int f1 = F1 + k*(dims[0]-1)*dims[1] + (j+1)*(dims[0]-1) + i; /* top */
        int f2 = (k+1)*(dims[0]-1)*(dims[1]-1) + j*(dims[0]-1) + i;  /* front */
        int f3 = k*(dims[0]-1)*(dims[1]-1) + j*(dims[0]-1) + i;      /* back  */
        int f4 = F1+F2 + k*dims[0]*(dims[1]-1) + j*dims[0] + i;      /* left */
        int f5 = F1+F2 + k*dims[0]*(dims[1]-1) + j*dims[0] + i+1;    /* right */

        /* This ordering works (see fms.h) */
        *cptr++ = f0;
        *cptr++ = f1;
        *cptr++ = f5;
        *cptr++ = f4;
        *cptr++ = f2;
        *cptr++ = f3;
      }
#ifdef DEBUG_PRINT
  for(i = 0; i < *ncells; i++)
    printf("cell %d: %d %d %d %d %d %d\n", i,
           cells[6*i+0],
           cells[6*i+1],
           cells[6*i+2],
           cells[6*i+3],
           cells[6*i+4],
           cells[6*i+5]
          );
#endif

  return cells;
}